

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O1

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  double *pdVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  code *pcVar18;
  code *pcVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  double *pdVar26;
  bool bVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  double dVar33;
  double dVar34;
  undefined4 uVar35;
  ulong local_158;
  double local_b8;
  undefined8 uStack_b0;
  double local_90;
  undefined1 local_48 [16];
  
  puVar6 = (uint *)S->content;
  uVar2 = *puVar6;
  uVar25 = (ulong)uVar2;
  uVar3 = puVar6[2];
  uVar4 = puVar6[3];
  puVar7 = *(undefined8 **)(puVar6 + 0x18);
  lVar8 = *(long *)(puVar6 + 0x1a);
  lVar9 = *(long *)(puVar6 + 0x1c);
  lVar10 = *(long *)(puVar6 + 0x1e);
  uVar11 = *(undefined8 *)(puVar6 + 0x20);
  pdVar12 = *(double **)(puVar6 + 0x22);
  uVar13 = *(undefined8 *)(puVar6 + 0x24);
  lVar14 = *(long *)(puVar6 + 0x14);
  lVar15 = *(long *)(puVar6 + 0x16);
  uVar16 = *(undefined8 *)(puVar6 + 0xc);
  uVar17 = *(undefined8 *)(puVar6 + 0x12);
  pcVar18 = *(code **)(puVar6 + 10);
  pcVar19 = *(code **)(puVar6 + 0x10);
  puVar20 = *(undefined8 **)(puVar6 + 0x26);
  puVar21 = *(undefined8 **)(puVar6 + 0x28);
  puVar6[5] = 0;
  uVar5 = puVar6[1];
  if (puVar6[4] == 0) {
    iVar22 = (*pcVar18)(uVar16,x,uVar13);
    if (iVar22 != 0) {
LAB_0011b481:
      puVar6[4] = 0;
      iVar28 = -0x325;
      iVar23 = 0x323;
LAB_0011b493:
      if (iVar22 < 0) {
        iVar23 = iVar28;
      }
      goto LAB_0011bbca;
    }
    N_VLinearSum(0x3ff0000000000000,b,uVar13,uVar13);
  }
  else {
    N_VScale(0x3ff0000000000000,b,uVar13);
  }
  if (lVar14 == 0) {
    N_VScale(0x3ff0000000000000,uVar13,*puVar7);
  }
  else {
    N_VProd(lVar14,uVar13);
  }
  dVar33 = (double)N_VDotProd();
  dVar34 = 0.0;
  if (0.0 < dVar33) {
    if (dVar33 < 0.0) {
      dVar34 = sqrt(dVar33);
    }
    else {
      dVar34 = SQRT(dVar33);
    }
  }
  *(double *)(puVar6 + 6) = dVar34;
  if (dVar34 <= delta) {
LAB_0011bbc0:
    puVar6[4] = 0;
    iVar23 = 0;
    goto LAB_0011bbca;
  }
  N_VConst(0,uVar11);
  dVar33 = dVar34;
  if (-1 < (int)uVar4) {
    uVar24 = 0;
    uVar35 = 0;
    uStack_b0._4_4_ = 0;
    local_48._8_8_ = 0;
    local_48._0_8_ = dVar34;
    local_158 = 0;
    local_b8 = dVar34;
    do {
      uStack_b0._0_4_ = uVar35;
      if (-1 < (int)uVar2) {
        uVar30 = 0;
        do {
          if (0 < (int)uVar2) {
            memset(*(void **)(lVar9 + uVar30 * 8),0,uVar25 * 8);
          }
          uVar30 = uVar30 + 1;
        } while (uVar2 + 1 != uVar30);
      }
      N_VScale(1.0 / local_b8);
      bVar27 = 0 < (int)uVar2;
      if (0 < (int)uVar2) {
        lVar32 = 4;
        local_90 = 1.0;
        uVar30 = 0;
        do {
          puVar6[5] = puVar6[5] + 1;
          if (lVar15 == 0) {
            N_VScale(0x3ff0000000000000,puVar7[uVar30],uVar13);
          }
          else {
            N_VDiv(puVar7[uVar30],lVar15,uVar13);
          }
          if (uVar5 - 1 < 3) {
            N_VScale(0x3ff0000000000000,uVar13,puVar7[uVar30 + 1]);
            iVar22 = (*pcVar19)(delta,uVar17,puVar7[uVar30 + 1],uVar13,2);
            if (iVar22 != 0) {
              puVar6[4] = 0;
              iVar28 = -0x328;
              iVar23 = 0x325;
              goto LAB_0011b493;
            }
          }
          N_VScale(0x3ff0000000000000,uVar13,*(undefined8 *)(lVar8 + uVar30 * 8));
          iVar22 = (*pcVar18)(uVar16,uVar13,puVar7[uVar30 + 1]);
          if (iVar22 != 0) goto LAB_0011b481;
          if (lVar14 != 0) {
            N_VProd(lVar14,puVar7[uVar30 + 1]);
          }
          uVar1 = uVar30 + 1;
          lVar31 = *(long *)(lVar9 + 8 + uVar30 * 8) + lVar32 + -4;
          if (uVar3 == 2) {
            SUNClassicalGS(puVar7,lVar9,uVar1 & 0xffffffff,uVar25,lVar31,puVar20,puVar21);
          }
          else {
            SUNModifiedGS(puVar7,lVar9,uVar1 & 0xffffffff,uVar25,lVar31);
          }
          iVar22 = SUNQRfact(uVar1 & 0xffffffff,lVar9,lVar10,uVar30 & 0xffffffff);
          if (iVar22 != 0) {
            puVar6[4] = 0;
            iVar23 = 0x327;
            goto LAB_0011bbca;
          }
          local_90 = local_90 * *(double *)(lVar10 + lVar32 * 2);
          dVar33 = ABS(local_b8 * local_90);
          *(double *)(puVar6 + 6) = dVar33;
          local_48._8_4_ = (int)(uStack_b0 & 0x7fffffffffffffff);
          local_48._0_8_ = dVar33;
          local_48._12_4_ = (int)((uStack_b0 & 0x7fffffffffffffff) >> 0x20);
          if (dVar33 <= delta) {
            local_158 = (ulong)((int)uVar30 + 1);
            break;
          }
          N_VScale(1.0 / *(double *)(*(long *)(lVar9 + 8 + uVar30 * 8) + uVar30 * 8));
          bVar27 = (long)uVar1 < (long)(int)uVar2;
          lVar32 = lVar32 + 8;
          uVar30 = uVar1;
          local_158 = uVar25;
        } while (uVar25 != uVar1);
      }
      *pdVar12 = local_b8;
      iVar22 = (int)local_158;
      if (0 < iVar22) {
        memset(pdVar12 + 1,0,local_158 * 8);
      }
      iVar23 = SUNQRsol(local_158,lVar9,lVar10,pdVar12);
      if (iVar23 != 0) {
        puVar6[4] = 0;
        iVar23 = -0x32b;
        goto LAB_0011bbca;
      }
      *puVar20 = 0x3ff0000000000000;
      *puVar21 = uVar11;
      if (0 < iVar22) {
        uVar30 = 0;
        do {
          puVar20[uVar30 + 1] = pdVar12[uVar30];
          puVar21[uVar30 + 1] = *(undefined8 *)(lVar8 + uVar30 * 8);
          uVar30 = uVar30 + 1;
        } while (local_158 != uVar30);
      }
      uVar29 = iVar22 + 1;
      N_VLinearCombination(uVar29,puVar20,puVar21,uVar11);
      if (bVar27) {
        if (puVar6[4] == 0) {
          N_VLinearSum(0x3ff0000000000000,0,x,uVar11,x);
        }
        else {
          N_VScale(0x3ff0000000000000,uVar11,x);
        }
        goto LAB_0011bbc0;
      }
      if (uVar24 == uVar4) goto LAB_0011bb26;
      dVar33 = 1.0;
      if (0 < iVar22) {
        pdVar26 = (double *)(local_158 * 0x10 + lVar10 + -8);
        lVar32 = local_158 + 1;
        dVar33 = 1.0;
        do {
          pdVar12[lVar32 + -1] = pdVar26[-1] * dVar33;
          dVar33 = dVar33 * *pdVar26;
          pdVar26 = pdVar26 + -2;
          lVar32 = lVar32 + -1;
        } while (1 < lVar32);
      }
      *pdVar12 = dVar33;
      if (-1 < iVar22) {
        uVar30 = 0;
        do {
          pdVar12[uVar30] = pdVar12[uVar30] * local_b8 * dVar33;
          uVar30 = uVar30 + 1;
        } while (uVar29 != uVar30);
      }
      if (-1 < iVar22) {
        uVar30 = 0;
        do {
          puVar20[uVar30] = pdVar12[uVar30];
          puVar21[uVar30] = puVar7[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar29 != uVar30);
      }
      local_b8 = ABS(local_b8 * dVar33);
      uVar35 = (undefined4)(uStack_b0 & 0x7fffffffffffffff);
      uStack_b0._4_4_ = (undefined4)((uStack_b0 & 0x7fffffffffffffff) >> 0x20);
      N_VLinearCombination(uVar29,puVar20,puVar21,*puVar7);
      uVar24 = uVar24 + 1;
    } while( true );
  }
  goto LAB_0011bb42;
LAB_0011bb26:
  dVar33 = local_48._0_8_;
LAB_0011bb42:
  if (dVar34 <= dVar33) {
    puVar6[4] = 0;
    iVar23 = 0x322;
  }
  else {
    if (puVar6[4] == 0) {
      N_VLinearSum(0x3ff0000000000000,0,x,uVar11);
    }
    else {
      N_VScale(0x3ff0000000000000,uVar11,x);
    }
    puVar6[4] = 0;
    iVar23 = 0x321;
  }
LAB_0011bbca:
  *(int *)((long)S->content + 0x20) = iVar23;
  return iVar23;
}

Assistant:

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                          N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  N_Vector *V, *Z, xcor, vtemp, s1, s2;
  sunrealtype **Hes, *givens, *yg, *res_norm;
  sunrealtype beta, rotation_product, r_norm, s_product, rho;
  sunbooleantype preOnRight, scale1, scale2, converged;
  sunbooleantype* zeroguess;
  int i, j, k, l, l_max, krydim, ntries, max_restarts, gstype;
  int* nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  int status;

  /* local shortcuts for fused vector operations */
  sunrealtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  krydim = 0;

  /* Make local shortcuts to solver variables. */
  l_max        = SPFGMR_CONTENT(S)->maxl;
  max_restarts = SPFGMR_CONTENT(S)->max_restarts;
  gstype       = SPFGMR_CONTENT(S)->gstype;
  V            = SPFGMR_CONTENT(S)->V;
  Z            = SPFGMR_CONTENT(S)->Z;
  Hes          = SPFGMR_CONTENT(S)->Hes;
  givens       = SPFGMR_CONTENT(S)->givens;
  xcor         = SPFGMR_CONTENT(S)->xcor;
  yg           = SPFGMR_CONTENT(S)->yg;
  vtemp        = SPFGMR_CONTENT(S)->vtemp;
  s1           = SPFGMR_CONTENT(S)->s1;
  s2           = SPFGMR_CONTENT(S)->s2;
  A_data       = SPFGMR_CONTENT(S)->ATData;
  P_data       = SPFGMR_CONTENT(S)->PData;
  atimes       = SPFGMR_CONTENT(S)->ATimes;
  psolve       = SPFGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPFGMR_CONTENT(S)->zeroguess);
  nli          = &(SPFGMR_CONTENT(S)->numiters);
  res_norm     = &(SPFGMR_CONTENT(S)->resnorm);
  cv           = SPFGMR_CONTENT(S)->cv;
  Xv           = SPFGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* Set sunbooleantype flags for internal solver options */
  preOnRight = ((SPFGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
                (SPFGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPFGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale1     = (s1 != NULL);
  scale2     = (s2 != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!preOnRight || psolve, SUN_ERR_ARG_CORRUPT);

  SUNLogInfo(S->sunctx->logger, "linear-solver", "solver = spfgmr");

  SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, vtemp);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, vtemp);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
    SUNCheckLastErr();
  }

  /* Apply left scaling to vtemp = r_0 to fill V[0]. */
  if (scale1)
  {
    N_VProd(s1, vtemp, V[0]);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp, V[0]);
    SUNCheckLastErr();
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 r_0, and return if small */
  r_norm = N_VDotProd(V[0], V[0]);
  SUNCheckLastErr();
  *res_norm = r_norm = beta = SUNRsqrt(r_norm);

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;

    SUNLogInfo(S->sunctx->logger,
               "end-linear-iterate", "cur-iter = 0, total-iters = 0, res-norm = %.16g, status = success",
               *res_norm);

    return (LASTFLAG(S));
  }

  SUNLogInfo(S->sunctx->logger,
             "end-linear-iterate", "cur-iter = 0, total-iters = 0, res-norm = %.16g, status = continue",
             *res_norm);

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0. */
  N_VConst(ZERO, xcor);
  SUNCheckLastErr();

  /* Begin outer iterations: up to (max_restarts + 1) attempts. */
  for (ntries = 0; ntries <= max_restarts; ntries++)
  {
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0].             */
    for (i = 0; i <= l_max; i++)
    {
      for (j = 0; j < l_max; j++) { Hes[i][j] = ZERO; }
    }
    rotation_product = ONE;
    N_VScale(ONE / r_norm, V[0], V[0]);
    SUNCheckLastErr();

    /* Inner loop: generate Krylov sequence and Arnoldi basis. */
    for (l = 0; l < l_max; l++)
    {
      SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

      (*nli)++;

      krydim = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 A P_inv s2_inv. */

      /*   Apply right scaling: vtemp = s2_inv V[l]. */
      if (scale2)
      {
        N_VDiv(V[l], s2, vtemp);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, V[l], vtemp);
        SUNCheckLastErr();
      }

      /*   Apply right preconditioner: vtemp = Z[l] = P_inv s2_inv V[l]. */
      if (preOnRight)
      {
        N_VScale(ONE, vtemp, V[l + 1]);
        SUNCheckLastErr();
        status = psolve(P_data, V[l + 1], vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed preconditioner solve, retval = %d", status);

          return (LASTFLAG(S));
        }
      }
      N_VScale(ONE, vtemp, Z[l]);
      SUNCheckLastErr();

      /*   Apply A: V[l+1] = A P_inv s2_inv V[l]. */
      status = atimes(A_data, vtemp, V[l + 1]);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                   : SUNLS_ATIMES_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed matvec, retval = %d", status);

        return (LASTFLAG(S));
      }

      /*   Apply left scaling: V[l+1] = s1 A P_inv s2_inv V[l]. */
      if (scale1)
      {
        N_VProd(s1, V[l + 1], V[l + 1]);
        SUNCheckLastErr();
      }

      /* Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde. */
      if (gstype == SUN_CLASSICAL_GS)
      {
        SUNCheckCall(
          SUNClassicalGS(V, Hes, l + 1, l_max, &(Hes[l + 1][l]), cv, Xv));
      }
      else
      {
        SUNCheckCall(SUNModifiedGS(V, Hes, l + 1, l_max, &(Hes[l + 1][l])));
      }

      /* Update the QR factorization of Hes. */
      if (SUNQRfact(krydim, Hes, givens, l) != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed QR factorization");

        return (LASTFLAG(S));
      }

      /* Update residual norm estimate; break if convergence test passes. */
      rotation_product *= givens[2 * l + 1];
      *res_norm = rho = SUNRabs(rotation_product * r_norm);

      SUNLogInfo(S->sunctx->logger, "linear-iterate",
                 "cur-iter = %i, total-iters = %i, res-norm = %.16g", l + 1,
                 *nli, *res_norm);

      if (rho <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine. */
      N_VScale(ONE / Hes[l + 1][l], V[l + 1], V[l + 1]);
      SUNCheckLastErr();

      SUNLogInfoIf(l < l_max - 1, S->sunctx->logger, "end-linear-iterate",
                   "status = continue");
    }

    /* Inner loop is done.  Compute the new correction vector xcor. */

    /*   Construct g, then solve for y. */
    yg[0] = r_norm;
    for (i = 1; i <= krydim; i++) { yg[i] = ZERO; }
    if (SUNQRsol(krydim, Hes, givens, yg) != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed QR solve");

      return (LASTFLAG(S));
    }

    /*   Add correction vector Z_l y to xcor. */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k = 0; k < krydim; k++)
    {
      cv[k + 1] = yg[k];
      Xv[k + 1] = Z[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, xcor));

    /* If converged, construct the final solution vector x and return. */
    if (converged)
    {
      if (*zeroguess)
      {
        N_VScale(ONE, xcor, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, ONE, xcor, x);
        SUNCheckLastErr();
      }
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUN_SUCCESS;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = success");

      return (LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart. */
    if (ntries == max_restarts) { break; }

    /* Construct last column of Q in yg. */
    s_product = ONE;
    for (i = krydim; i > 0; i--)
    {
      yg[i] = s_product * givens[2 * i - 2];
      s_product *= givens[2 * i - 1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg. */
    r_norm *= s_product;
    for (i = 0; i <= krydim; i++) { yg[i] *= r_norm; }
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart. */
    for (k = 0; k <= krydim; k++)
    {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, V[0]));

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = continue");
  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta)
  {
    if (*zeroguess)
    {
      N_VScale(ONE, xcor, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, ONE, xcor, x);
      SUNCheckLastErr();
    }
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed residual reduced");

    return (LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;

  SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
             "status = failed max iterations");

  return (LASTFLAG(S));
}